

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O0

void __thiscall lunasvg::SVGUseElement::SVGUseElement(SVGUseElement *this,Document *document)

{
  Document *document_local;
  SVGUseElement *this_local;
  
  SVGGraphicsElement::SVGGraphicsElement(&this->super_SVGGraphicsElement,document,Use);
  (this->super_SVGGraphicsElement).super_SVGElement.super_SVGNode._vptr_SVGNode =
       (_func_int **)&PTR__SVGUseElement_001c1ac8;
  SVGURIReference::SVGURIReference(&this->super_SVGURIReference,(SVGElement *)this);
  (this->super_SVGGraphicsElement).super_SVGElement.super_SVGNode._vptr_SVGNode =
       (_func_int **)&PTR__SVGUseElement_001c1ac8;
  SVGLength::SVGLength(&this->m_x,X,Horizontal,Allow,0.0,None);
  SVGLength::SVGLength(&this->m_y,Y,Vertical,Allow,0.0,None);
  SVGLength::SVGLength(&this->m_width,Width,Horizontal,Forbid,100.0,Percent);
  SVGLength::SVGLength(&this->m_height,Height,Vertical,Forbid,100.0,Percent);
  SVGElement::addProperty((SVGElement *)this,&(this->m_x).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_y).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_width).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_height).super_SVGProperty);
  return;
}

Assistant:

SVGUseElement::SVGUseElement(Document* document)
    : SVGGraphicsElement(document, ElementID::Use)
    , SVGURIReference(this)
    , m_x(PropertyID::X, LengthDirection::Horizontal, LengthNegativeMode::Allow, 0.f, LengthUnits::None)
    , m_y(PropertyID::Y, LengthDirection::Vertical, LengthNegativeMode::Allow, 0.f, LengthUnits::None)
    , m_width(PropertyID::Width, LengthDirection::Horizontal, LengthNegativeMode::Forbid, 100.f, LengthUnits::Percent)
    , m_height(PropertyID::Height, LengthDirection::Vertical, LengthNegativeMode::Forbid, 100.f, LengthUnits::Percent)
{
    addProperty(m_x);
    addProperty(m_y);
    addProperty(m_width);
    addProperty(m_height);
}